

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

int ElCompar(void *El1,void *El2)

{
  int iVar1;
  
  iVar1 = 1;
  if (*El1 <= *El2) {
    iVar1 = -(uint)(*El1 < *El2);
  }
  return iVar1;
}

Assistant:

static int ElCompar(const void *El1, const void *El2)
/* compares positions of two matrix elements */
{
    int Compar;

    Compar = 0;
    if (((ElType *)El1)->Pos < ((ElType *)El2)->Pos)
        Compar = -1;
    if (((ElType *)El1)->Pos > ((ElType *)El2)->Pos)
        Compar = +1;

    return(Compar);
}